

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t * opj_pi_create_decode(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_PROG_ORDER OVar2;
  opj_tcp_t *poVar3;
  opj_pi_resolution_t *poVar4;
  OPJ_UINT32 *pOVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 **ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  OPJ_INT16 *pOVar9;
  OPJ_UINT32 OVar10;
  ulong uVar11;
  OPJ_UINT32 **ppOVar12;
  long lVar13;
  OPJ_PROG_ORDER *pOVar14;
  ulong uVar15;
  OPJ_BOOL *pOVar16;
  uint uVar17;
  int iVar18;
  opj_pi_comp_t *poVar19;
  opj_pi_iterator_t *poVar20;
  opj_image_comp_t *poVar21;
  uint uVar22;
  opj_poc_t *poVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_50;
  ulong local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x56a,
                  "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
  }
  if (p_tile_no < p_cp->th * p_cp->tw) {
    uVar1 = p_image->numcomps;
    uVar15 = (ulong)uVar1;
    poVar3 = p_cp->tcps;
    local_48 = (ulong)poVar3[p_tile_no].numpocs;
    ptr = (OPJ_UINT32 **)opj_malloc((ulong)(uVar1 * 0x84) << 2);
    if (ptr != (OPJ_UINT32 **)0x0) {
      p_resolutions = (OPJ_UINT32 **)opj_malloc(uVar15 * 8);
      if (p_resolutions != (OPJ_UINT32 **)0x0) {
        p_pi = opj_pi_create(p_image,p_cp,p_tile_no);
        auVar6 = _DAT_0013c070;
        if (p_pi != (opj_pi_iterator_t *)0x0) {
          if (uVar15 != 0) {
            lVar13 = uVar15 - 1;
            auVar25._8_4_ = (int)lVar13;
            auVar25._0_8_ = lVar13;
            auVar25._12_4_ = (int)((ulong)lVar13 >> 0x20);
            uVar11 = 0;
            auVar25 = auVar25 ^ _DAT_0013c070;
            ppOVar12 = ptr;
            auVar26 = _DAT_0013c060;
            do {
              auVar27._8_4_ = (int)ppOVar12;
              auVar27._0_8_ = ppOVar12;
              auVar27._12_4_ = (int)((ulong)ppOVar12 >> 0x20);
              auVar28 = auVar26 ^ auVar6;
              if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                          auVar25._4_4_ < auVar28._4_4_) & 1)) {
                *(OPJ_UINT32 ***)((long)p_resolutions + uVar11) = ppOVar12;
              }
              if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
                  auVar28._12_4_ <= auVar25._12_4_) {
                *(long *)((long)p_resolutions + uVar11 + 8) = auVar27._8_8_ + 0x210;
              }
              lVar13 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 2;
              auVar26._8_8_ = lVar13 + 2;
              ppOVar12 = ppOVar12 + 0x84;
              uVar11 = uVar11 + 0x10;
            } while ((uVar15 * 8 + 8 & 0xfffffffffffffff0) != uVar11);
          }
          uVar7 = (int)local_48 + 1;
          opj_get_all_encoding_parameters
                    (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,
                     &l_max_prec,&l_max_res,p_resolutions);
          OVar8 = l_max_prec * uVar1;
          uVar22 = l_max_res * OVar8;
          p_pi->include = (OPJ_INT16 *)0x0;
          uVar17 = poVar3[p_tile_no].numlayers + 1;
          if ((int)((ulong)uVar17 * (ulong)uVar22 >> 0x20) == 0) {
            uVar17 = uVar17 * uVar22;
            p_pi->include_size = uVar17;
            pOVar9 = (OPJ_INT16 *)opj_calloc((ulong)uVar17,2);
            p_pi->include = pOVar9;
            if (pOVar9 != (OPJ_INT16 *)0x0) {
              poVar19 = p_pi->comps;
              local_50 = p_image->comps;
              p_pi->tx0 = l_tx0;
              p_pi->ty0 = l_ty0;
              p_pi->tx1 = l_tx1;
              p_pi->ty1 = l_ty1;
              p_pi->step_p = 1;
              p_pi->step_c = l_max_prec;
              p_pi->step_r = OVar8;
              p_pi->step_l = uVar22;
              if (uVar1 != 0) {
                uVar11 = 0;
                poVar21 = local_50;
                do {
                  poVar4 = poVar19->resolutions;
                  pOVar5 = p_resolutions[uVar11];
                  OVar10 = poVar21->dy;
                  poVar19->dx = poVar21->dx;
                  poVar19->dy = OVar10;
                  OVar10 = poVar19->numresolutions;
                  if (OVar10 != 0) {
                    lVar13 = 0;
                    do {
                      *(undefined4 *)((long)&poVar4->pdx + lVar13) =
                           *(undefined4 *)((long)pOVar5 + lVar13);
                      *(undefined4 *)((long)&poVar4->pdy + lVar13) =
                           *(undefined4 *)((long)pOVar5 + lVar13 + 4);
                      *(undefined4 *)((long)&poVar4->pw + lVar13) =
                           *(undefined4 *)((long)pOVar5 + lVar13 + 8);
                      *(undefined4 *)((long)&poVar4->ph + lVar13) =
                           *(undefined4 *)((long)pOVar5 + lVar13 + 0xc);
                      lVar13 = lVar13 + 0x10;
                      OVar10 = OVar10 - 1;
                    } while (OVar10 != 0);
                  }
                  poVar19 = poVar19 + 1;
                  poVar21 = poVar21 + 1;
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar15);
              }
              if (1 < uVar7) {
                poVar20 = p_pi;
                iVar18 = 1;
                do {
                  poVar19 = poVar20[1].comps;
                  poVar20[1].tx0 = l_tx0;
                  poVar20[1].ty0 = l_ty0;
                  poVar20[1].tx1 = l_tx1;
                  poVar20[1].ty1 = l_ty1;
                  poVar20[1].step_p = 1;
                  poVar20[1].step_c = l_max_prec;
                  poVar20[1].step_r = OVar8;
                  poVar20[1].step_l = uVar22;
                  if (uVar1 != 0) {
                    uVar11 = 0;
                    poVar21 = local_50;
                    do {
                      poVar4 = poVar19->resolutions;
                      pOVar5 = p_resolutions[uVar11];
                      OVar10 = poVar21->dy;
                      poVar19->dx = poVar21->dx;
                      poVar19->dy = OVar10;
                      OVar10 = poVar19->numresolutions;
                      if (OVar10 != 0) {
                        lVar13 = 0;
                        do {
                          *(undefined4 *)((long)&poVar4->pdx + lVar13) =
                               *(undefined4 *)((long)pOVar5 + lVar13);
                          *(undefined4 *)((long)&poVar4->pdy + lVar13) =
                               *(undefined4 *)((long)pOVar5 + lVar13 + 4);
                          *(undefined4 *)((long)&poVar4->pw + lVar13) =
                               *(undefined4 *)((long)pOVar5 + lVar13 + 8);
                          *(undefined4 *)((long)&poVar4->ph + lVar13) =
                               *(undefined4 *)((long)pOVar5 + lVar13 + 0xc);
                          lVar13 = lVar13 + 0x10;
                          OVar10 = OVar10 - 1;
                        } while (OVar10 != 0);
                      }
                      poVar19 = poVar19 + 1;
                      poVar21 = poVar21 + 1;
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != uVar15);
                  }
                  poVar20[1].include = poVar20->include;
                  poVar20[1].include_size = poVar20->include_size;
                  poVar20 = poVar20 + 1;
                  bVar24 = iVar18 != (int)local_48;
                  iVar18 = iVar18 + 1;
                } while (bVar24);
              }
              opj_free(ptr);
              opj_free(p_resolutions);
              OVar8 = poVar3[p_tile_no].numpocs;
              if ((poVar3[p_tile_no].field_0x1638 & 4) != 0) {
                if (OVar8 != 0xffffffff) {
                  uVar1 = poVar3[p_tile_no].numlayers;
                  poVar23 = poVar3[p_tile_no].pocs;
                  pOVar14 = &(p_pi->poc).prg;
                  iVar18 = OVar8 + 1;
                  do {
                    *pOVar14 = poVar23->prg;
                    pOVar14[-10] = 1;
                    OVar8 = poVar23->compno0;
                    ((opj_poc_t *)(pOVar14 + -9))->resno0 = poVar23->resno0;
                    ((opj_poc_t *)(pOVar14 + -9))->compno0 = OVar8;
                    *(undefined8 *)(pOVar14 + -4) = 0;
                    *(undefined8 *)(pOVar14 + -6) = *(undefined8 *)&poVar23->resno1;
                    uVar7 = poVar23->layno1;
                    if (uVar1 <= poVar23->layno1) {
                      uVar7 = uVar1;
                    }
                    pOVar14[-7] = uVar7;
                    pOVar14[-2] = l_max_prec;
                    poVar23 = poVar23 + 1;
                    pOVar14 = pOVar14 + 0x3e;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                  return p_pi;
                }
                return p_pi;
              }
              if (OVar8 != 0xffffffff) {
                OVar2 = poVar3[p_tile_no].prg;
                OVar10 = poVar3[p_tile_no].numlayers;
                pOVar16 = &p_pi->first;
                iVar18 = OVar8 + 1;
                do {
                  pOVar16[10] = OVar2;
                  *(undefined8 *)pOVar16 = 1;
                  pOVar16[2] = 0;
                  *(undefined8 *)(pOVar16 + 6) = 0;
                  pOVar16[4] = l_max_res;
                  pOVar16[5] = pOVar16[0x26];
                  pOVar16[3] = OVar10;
                  pOVar16[8] = l_max_prec;
                  pOVar16 = pOVar16 + 0x3e;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
                return p_pi;
              }
              return p_pi;
            }
          }
          opj_free(ptr);
          opj_free(p_resolutions);
          opj_pi_destroy(p_pi,uVar7);
          return (opj_pi_iterator_t *)0x0;
        }
        opj_free(ptr);
        ptr = p_resolutions;
      }
      opj_free(ptr);
    }
    return (opj_pi_iterator_t *)0x0;
  }
  __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x56c,
                "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
}

Assistant:

opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *p_image,
                                        opj_cp_t *p_cp,
                                        OPJ_UINT32 p_tile_no)
{
    OPJ_UINT32 numcomps = p_image->numcomps;

    /* loop */
    OPJ_UINT32 pino;
    OPJ_UINT32 compno, resno;

    /* to store w, h, dx and dy fro all components and resolutions */
    OPJ_UINT32 * l_tmp_data;
    OPJ_UINT32 ** l_tmp_ptr;

    /* encoding prameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;
    OPJ_UINT32 l_bound;
    OPJ_UINT32 l_step_p, l_step_c, l_step_r, l_step_l ;
    OPJ_UINT32 l_data_stride;

    /* pointers */
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *l_tcp = 00;
    const opj_tccp_t *l_tccp = 00;
    opj_pi_comp_t *l_current_comp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_pi_iterator_t * l_current_pi = 00;
    OPJ_UINT32 * l_encoding_value_ptr = 00;

    /* preconditions in debug */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* initializations */
    l_tcp = &p_cp->tcps[p_tile_no];
    l_bound = l_tcp->numpocs + 1;

    l_data_stride = 4 * OPJ_J2K_MAXRLVLS;
    l_tmp_data = (OPJ_UINT32*)opj_malloc(
                     l_data_stride * numcomps * sizeof(OPJ_UINT32));
    if
    (! l_tmp_data) {
        return 00;
    }
    l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
                    numcomps * sizeof(OPJ_UINT32 *));
    if
    (! l_tmp_ptr) {
        opj_free(l_tmp_data);
        return 00;
    }

    /* memory allocation for pi */
    l_pi = opj_pi_create(p_image, p_cp, p_tile_no);
    if (!l_pi) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        return 00;
    }

    l_encoding_value_ptr = l_tmp_data;
    /* update pointer array */
    for
    (compno = 0; compno < numcomps; ++compno) {
        l_tmp_ptr[compno] = l_encoding_value_ptr;
        l_encoding_value_ptr += l_data_stride;
    }
    /* get encoding parameters */
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, l_tmp_ptr);

    /* step calculations */
    l_step_p = 1;
    l_step_c = l_max_prec * l_step_p;
    l_step_r = numcomps * l_step_c;
    l_step_l = l_max_res * l_step_r;

    /* set values for first packet iterator */
    l_current_pi = l_pi;

    /* memory allocation for include */
    /* prevent an integer overflow issue */
    /* 0 < l_tcp->numlayers < 65536 c.f. opj_j2k_read_cod in j2k.c */
    l_current_pi->include = 00;
    if (l_step_l <= (UINT_MAX / (l_tcp->numlayers + 1U))) {
        l_current_pi->include_size = (l_tcp->numlayers + 1U) * l_step_l;
        l_current_pi->include = (OPJ_INT16*) opj_calloc(
                                    l_current_pi->include_size, sizeof(OPJ_INT16));
    }

    if (!l_current_pi->include) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        opj_pi_destroy(l_pi, l_bound);
        return 00;
    }

    /* special treatment for the first packet iterator */
    l_current_comp = l_current_pi->comps;
    l_img_comp = p_image->comps;
    l_tccp = l_tcp->tccps;

    l_current_pi->tx0 = l_tx0;
    l_current_pi->ty0 = l_ty0;
    l_current_pi->tx1 = l_tx1;
    l_current_pi->ty1 = l_ty1;

    /*l_current_pi->dx = l_img_comp->dx;*/
    /*l_current_pi->dy = l_img_comp->dy;*/

    l_current_pi->step_p = l_step_p;
    l_current_pi->step_c = l_step_c;
    l_current_pi->step_r = l_step_r;
    l_current_pi->step_l = l_step_l;

    /* allocation for components and number of components has already been calculated by opj_pi_create */
    for
    (compno = 0; compno < numcomps; ++compno) {
        opj_pi_resolution_t *l_res = l_current_comp->resolutions;
        l_encoding_value_ptr = l_tmp_ptr[compno];

        l_current_comp->dx = l_img_comp->dx;
        l_current_comp->dy = l_img_comp->dy;
        /* resolutions have already been initialized */
        for
        (resno = 0; resno < l_current_comp->numresolutions; resno++) {
            l_res->pdx = *(l_encoding_value_ptr++);
            l_res->pdy = *(l_encoding_value_ptr++);
            l_res->pw =  *(l_encoding_value_ptr++);
            l_res->ph =  *(l_encoding_value_ptr++);
            ++l_res;
        }
        ++l_current_comp;
        ++l_img_comp;
        ++l_tccp;
    }
    ++l_current_pi;

    for (pino = 1 ; pino < l_bound ; ++pino) {
        l_current_comp = l_current_pi->comps;
        l_img_comp = p_image->comps;
        l_tccp = l_tcp->tccps;

        l_current_pi->tx0 = l_tx0;
        l_current_pi->ty0 = l_ty0;
        l_current_pi->tx1 = l_tx1;
        l_current_pi->ty1 = l_ty1;
        /*l_current_pi->dx = l_dx_min;*/
        /*l_current_pi->dy = l_dy_min;*/
        l_current_pi->step_p = l_step_p;
        l_current_pi->step_c = l_step_c;
        l_current_pi->step_r = l_step_r;
        l_current_pi->step_l = l_step_l;

        /* allocation for components and number of components has already been calculated by opj_pi_create */
        for
        (compno = 0; compno < numcomps; ++compno) {
            opj_pi_resolution_t *l_res = l_current_comp->resolutions;
            l_encoding_value_ptr = l_tmp_ptr[compno];

            l_current_comp->dx = l_img_comp->dx;
            l_current_comp->dy = l_img_comp->dy;
            /* resolutions have already been initialized */
            for
            (resno = 0; resno < l_current_comp->numresolutions; resno++) {
                l_res->pdx = *(l_encoding_value_ptr++);
                l_res->pdy = *(l_encoding_value_ptr++);
                l_res->pw =  *(l_encoding_value_ptr++);
                l_res->ph =  *(l_encoding_value_ptr++);
                ++l_res;
            }
            ++l_current_comp;
            ++l_img_comp;
            ++l_tccp;
        }
        /* special treatment*/
        l_current_pi->include = (l_current_pi - 1)->include;
        l_current_pi->include_size = (l_current_pi - 1)->include_size;
        ++l_current_pi;
    }
    opj_free(l_tmp_data);
    l_tmp_data = 00;
    opj_free(l_tmp_ptr);
    l_tmp_ptr = 00;
    if
    (l_tcp->POC) {
        opj_pi_update_decode_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    } else {
        opj_pi_update_decode_not_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    }
    return l_pi;
}